

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

uint32_t __thiscall nuraft::buffer_serializer::get_u32(buffer_serializer *this)

{
  bool bVar1;
  overflow_error *this_00;
  byte *pbVar2;
  uint32_t *new_pos;
  buffer_serializer *in_RDI;
  uint32_t tmp_1;
  uint32_t tmp;
  uint8_t *ptr;
  uint32_t ret;
  size_t in_stack_ffffffffffffffc0;
  buffer_serializer *in_stack_ffffffffffffffe0;
  uint32_t local_c;
  
  bVar1 = is_valid(in_RDI,in_stack_ffffffffffffffc0);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar2 = buffer::data_begin(in_RDI->buf_);
  new_pos = (uint32_t *)(pbVar2 + in_RDI->pos_);
  if (in_RDI->endian_ == LITTLE) {
    local_c = *new_pos;
  }
  else {
    local_c = CONCAT31(CONCAT21(CONCAT11((char)*new_pos,*(undefined1 *)((long)new_pos + 1)),
                                *(undefined1 *)((long)new_pos + 2)),
                       *(undefined1 *)((long)new_pos + 3));
  }
  pos(in_RDI);
  pos(in_stack_ffffffffffffffe0,(size_t)new_pos);
  return local_c;
}

Assistant:

uint32_t buffer_serializer::get_u32() {
    uint32_t ret = 0;
    chk_length(ret);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { get32l(ptr, ret); }
    else                    { get32b(ptr, ret); }
    pos( pos() + sizeof(ret) );
    return ret;
}